

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O2

void __thiscall
rest_rpc::rpc_client::async_call<0ul>
          (rpc_client *this,string *rpc_name,
          function<void_(std::error_code,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>
          *cb)

{
  ulong uVar1;
  error_category *peVar2;
  error_code __args;
  buffer_type ret;
  ulong local_60;
  msgpack_codec codec;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  if (((this->has_connected_)._M_base._M_i & 1U) == 0) {
    if ((cb->super__Function_base)._M_manager != (_Manager_type)0x0) {
      peVar2 = asio::system_category();
      nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_30,"not connected");
      __args._M_cat = peVar2;
      __args._0_8_ = 0x6b;
      std::
      function<void_(std::error_code,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>
      ::operator()(cb,__args,local_30);
    }
  }
  else {
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&codec,&this->cb_mtx_);
    local_60 = this->callback_id_ + 1 | 0x8000000000000000;
    this->callback_id_ = local_60;
    std::
    make_shared<rest_rpc::rpc_client::call_t,asio::io_context&,std::function<void(std::error_code,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>)>,unsigned_long>
              ((io_context *)&ret,
               (function<void_(std::error_code,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>
                *)&this->ios_,(unsigned_long *)cb);
    call_t::start_timer((call_t *)ret.m_size);
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<rest_rpc::rpc_client::call_t>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<rest_rpc::rpc_client::call_t>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_long&,std::shared_ptr<rest_rpc::rpc_client::call_t>&>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<rest_rpc::rpc_client::call_t>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<rest_rpc::rpc_client::call_t>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->callback_map_,&local_60,&ret);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ret.m_data);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&codec);
    codec.msg_.m_obj.super_object.type = NIL;
    codec.msg_.m_zone._M_t.
    super___uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>._M_t.
    super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>.
    super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl =
         (__uniq_ptr_data<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>,_true,_true>)
         (__uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>)0x0;
    rpc_service::msgpack_codec::pack_args<>();
    uVar1 = local_60;
    MD5::MD5Hash32((rpc_name->_M_dataplus)._M_p);
    write(this,(int)uVar1,(void *)0x0,(size_t)&ret);
    free(ret.m_data);
    std::unique_ptr<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>::~unique_ptr
              (&codec.msg_.m_zone);
  }
  return;
}

Assistant:

void async_call(const std::string &rpc_name,
                  std::function<void(asio::error_code, string_view)> cb,
                  Args &&...args) {
    if (!has_connected_) {
      if (cb)
        cb(asio::error::make_error_code(asio::error::not_connected),
           "not connected");
      return;
    }

    uint64_t cb_id = 0;
    {
      std::unique_lock<std::mutex> lock(cb_mtx_);
      callback_id_++;
      callback_id_ |= (uint64_t(1) << 63);
      cb_id = callback_id_;
      auto call = std::make_shared<call_t>(ios_, std::move(cb), TIMEOUT);
      call->start_timer();
      callback_map_.emplace(cb_id, call);
    }

    rpc_service::msgpack_codec codec;
    auto ret = codec.pack_args(std::forward<Args>(args)...);
    write(cb_id, request_type::req_res, std::move(ret),
          MD5::MD5Hash32(rpc_name.data()));
  }